

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandInit(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  Abc_Ntk_t *pNtk_00;
  size_t sVar8;
  Abc_Obj_t *pAVar9;
  time_t tVar10;
  Aig_Man_t *pAig;
  Vec_Int_t *p;
  char *pcVar11;
  Vec_Int_t *vFailState;
  Aig_Man_t *pMan;
  int i;
  int c;
  int fUseCexNs;
  int fUseCexCs;
  int fDontCare;
  int fRandom;
  int fOnes;
  int fZeros;
  char *pInitStr;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  _fOnes = (char *)0x0;
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  bVar4 = false;
  bVar5 = false;
  i = 0;
  Extra_UtilGetoptReset();
LAB_00284e3c:
  iVar6 = Extra_UtilGetopt(argc,argv,"Szordcnh");
  if (iVar6 == -1) {
    if (pNtk_00 == (Abc_Ntk_t *)0x0) {
      Abc_Print(-1,"Empty network.\n");
      pAbc_local._4_4_ = 1;
    }
    else {
      iVar6 = Abc_NtkIsComb(pNtk_00);
      if (iVar6 == 0) {
        if (_fOnes == (char *)0x0) {
          if (bVar1) {
            for (pMan._0_4_ = 0; iVar6 = Vec_PtrSize(pNtk_00->vBoxes), (int)pMan < iVar6;
                pMan._0_4_ = (int)pMan + 1) {
              pAVar9 = Abc_NtkBox(pNtk_00,(int)pMan);
              iVar6 = Abc_ObjIsLatch(pAVar9);
              if (iVar6 != 0) {
                Abc_LatchSetInit0(pAVar9);
              }
            }
          }
          else if (bVar2) {
            for (pMan._0_4_ = 0; iVar6 = Vec_PtrSize(pNtk_00->vBoxes), (int)pMan < iVar6;
                pMan._0_4_ = (int)pMan + 1) {
              pAVar9 = Abc_NtkBox(pNtk_00,(int)pMan);
              iVar6 = Abc_ObjIsLatch(pAVar9);
              if (iVar6 != 0) {
                Abc_LatchSetInit1(pAVar9);
              }
            }
          }
          else if (bVar3) {
            tVar10 = time((time_t *)0x0);
            srand((uint)tVar10);
            for (pMan._0_4_ = 0; iVar6 = Vec_PtrSize(pNtk_00->vBoxes), (int)pMan < iVar6;
                pMan._0_4_ = (int)pMan + 1) {
              pAVar9 = Abc_NtkBox(pNtk_00,(int)pMan);
              iVar6 = Abc_ObjIsLatch(pAVar9);
              if (iVar6 != 0) {
                uVar7 = rand();
                if ((uVar7 & 1) == 0) {
                  Abc_LatchSetInit0(pAVar9);
                }
                else {
                  Abc_LatchSetInit1(pAVar9);
                }
              }
            }
          }
          else if (bVar4) {
            for (pMan._0_4_ = 0; iVar6 = Vec_PtrSize(pNtk_00->vBoxes), (int)pMan < iVar6;
                pMan._0_4_ = (int)pMan + 1) {
              pAVar9 = Abc_NtkBox(pNtk_00,(int)pMan);
              iVar6 = Abc_ObjIsLatch(pAVar9);
              if (iVar6 != 0) {
                Abc_LatchSetInitDc(pAVar9);
              }
            }
          }
          else if ((bVar5) || (i != 0)) {
            if ((bVar5) && (i != 0)) {
              Abc_Print(-1,"The two options (-c and -n) are incompatible.\n");
              return 0;
            }
            iVar6 = Abc_NtkIsStrash(pNtk_00);
            if (iVar6 == 0) {
              Abc_Print(-1,"The current network should be an AIG.\n");
              return 0;
            }
            if (pAbc->pCex == (Abc_Cex_t *)0x0) {
              Abc_Print(-1,"The current CEX is not available.\n");
              return 0;
            }
            pAig = Abc_NtkToDar(pNtk_00,0,1);
            p = Saig_ManReturnFailingState(pAig,pAbc->pCex,i);
            Aig_ManStop(pAig);
            for (pMan._0_4_ = 0; iVar6 = Vec_PtrSize(pNtk_00->vBoxes), (int)pMan < iVar6;
                pMan._0_4_ = (int)pMan + 1) {
              pAVar9 = Abc_NtkBox(pNtk_00,(int)pMan);
              iVar6 = Abc_ObjIsLatch(pAVar9);
              if (iVar6 != 0) {
                iVar6 = Vec_IntEntry(p,(int)pMan);
                if (iVar6 == 0) {
                  Abc_LatchSetInit0(pAVar9);
                }
                else {
                  Abc_LatchSetInit1(pAVar9);
                }
              }
            }
            Vec_IntFree(p);
          }
          else {
            Abc_Print(-1,"The initial states remain unchanged.\n");
          }
          pAbc_local._4_4_ = 0;
        }
        else {
          sVar8 = strlen(_fOnes);
          iVar6 = Abc_NtkLatchNum(pNtk_00);
          if ((int)sVar8 == iVar6) {
            for (pMan._0_4_ = 0; iVar6 = Vec_PtrSize(pNtk_00->vBoxes), (int)pMan < iVar6;
                pMan._0_4_ = (int)pMan + 1) {
              pAVar9 = Abc_NtkBox(pNtk_00,(int)pMan);
              iVar6 = Abc_ObjIsLatch(pAVar9);
              if (iVar6 != 0) {
                if (_fOnes[(int)pMan] == '0') {
                  Abc_LatchSetInit0(pAVar9);
                }
                else if (_fOnes[(int)pMan] == '1') {
                  Abc_LatchSetInit1(pAVar9);
                }
                else {
                  Abc_LatchSetInitDc(pAVar9);
                }
              }
            }
            pAbc_local._4_4_ = 0;
          }
          else {
            sVar8 = strlen(_fOnes);
            uVar7 = Abc_NtkLatchNum(pNtk_00);
            Abc_Print(-1,"The length of init string (%d) differs from the number of flops (%d).\n",
                      sVar8,(ulong)uVar7);
            pAbc_local._4_4_ = 1;
          }
        }
      }
      else {
        Abc_Print(0,"The current network is combinational.\n");
        pAbc_local._4_4_ = 0;
      }
    }
    return pAbc_local._4_4_;
  }
  switch(iVar6) {
  case 0x53:
    if (globalUtilOptind < argc) {
      _fOnes = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00284e3c;
    }
    Abc_Print(-1,"Command line switch \"-S\" should be followed by a file name.\n");
    break;
  default:
    break;
  case 99:
    bVar5 = (bool)(bVar5 ^ 1);
    goto LAB_00284e3c;
  case 100:
    bVar4 = (bool)(bVar4 ^ 1);
    goto LAB_00284e3c;
  case 0x68:
    break;
  case 0x6e:
    i = i ^ 1;
    goto LAB_00284e3c;
  case 0x6f:
    bVar2 = (bool)(bVar2 ^ 1);
    goto LAB_00284e3c;
  case 0x72:
    bVar3 = (bool)(bVar3 ^ 1);
    goto LAB_00284e3c;
  case 0x7a:
    goto switchD_00284e82_caseD_7a;
  }
  Abc_Print(-2,"usage: init [-zordcnh] [-S <init_string>]\n");
  Abc_Print(-2,"\t         resets initial states of all latches\n");
  pcVar11 = "no";
  if (bVar1) {
    pcVar11 = "yes";
  }
  Abc_Print(-2,"\t-z     : set zeros initial states [default = %s]\n",pcVar11);
  pcVar11 = "no";
  if (bVar2) {
    pcVar11 = "yes";
  }
  Abc_Print(-2,"\t-o     : set ones initial states [default = %s]\n",pcVar11);
  pcVar11 = "no";
  if (bVar4) {
    pcVar11 = "yes";
  }
  Abc_Print(-2,"\t-d     : set don\'t-care initial states [default = %s]\n",pcVar11);
  pcVar11 = "no";
  if (bVar3) {
    pcVar11 = "yes";
  }
  Abc_Print(-2,"\t-r     : set random initial states [default = %s]\n",pcVar11);
  pcVar11 = "no";
  if (bVar5) {
    pcVar11 = "yes";
  }
  Abc_Print(-2,
            "\t-c     : set failure current state from the CEX (and run \"zero\") [default = %s]\n",
            pcVar11);
  pcVar11 = "no";
  if (i != 0) {
    pcVar11 = "yes";
  }
  Abc_Print(-2,
            "\t-n     : set next state after failure from the CEX (and run \"zero\") [default = %s]\n"
            ,pcVar11);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  Abc_Print(-2,"\t-S str : (optional) initial state  [default = unused]\n");
  return 1;
switchD_00284e82_caseD_7a:
  bVar1 = (bool)(bVar1 ^ 1);
  goto LAB_00284e3c;
}

Assistant:

int Abc_CommandInit( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    Abc_Obj_t * pObj;
    char * pInitStr = NULL;
    int fZeros    = 0;
    int fOnes     = 0;
    int fRandom   = 0;
    int fDontCare = 0;
    int fUseCexCs = 0;
    int fUseCexNs = 0;
    int c, i;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Szordcnh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a file name.\n" );
                goto usage;
            }
            pInitStr = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'z':
            fZeros ^= 1;
            break;
        case 'o':
            fOnes ^= 1;
            break;
        case 'r':
            fRandom ^= 1;
            break;
        case 'd':
            fDontCare ^= 1;
            break;
        case 'c':
            fUseCexCs ^= 1;
            break;
        case 'n':
            fUseCexNs ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( 0, "The current network is combinational.\n" );
        return 0;
    }

    if ( pInitStr != NULL )
    {
        if ( (int)strlen(pInitStr) != Abc_NtkLatchNum(pNtk) )
        {
            Abc_Print( -1, "The length of init string (%d) differs from the number of flops (%d).\n", strlen(pInitStr), Abc_NtkLatchNum(pNtk) );
            return 1;
        }
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( pInitStr[i] == '0' )
                Abc_LatchSetInit0( pObj );
            else if ( pInitStr[i] == '1' )
                Abc_LatchSetInit1( pObj );
            else
                Abc_LatchSetInitDc( pObj );
        return 0;
    }

    if ( fZeros )
    {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_LatchSetInit0( pObj );
    }
    else if ( fOnes )
    {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_LatchSetInit1( pObj );
    }
    else if ( fRandom )
    {
        srand( time(NULL) );
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( rand() & 1 )
                Abc_LatchSetInit1( pObj );
            else
                Abc_LatchSetInit0( pObj );
    }
    else if ( fDontCare )
    {
        Abc_NtkForEachLatch( pNtk, pObj, i )
            Abc_LatchSetInitDc( pObj );
    }
    else if ( fUseCexCs || fUseCexNs )
    {
        extern Vec_Int_t * Saig_ManReturnFailingState( Aig_Man_t * pMan, Abc_Cex_t * p, int fNextOne );
        Aig_Man_t * pMan;
        Vec_Int_t * vFailState;
        if ( fUseCexCs && fUseCexNs )
        {
            Abc_Print( -1, "The two options (-c and -n) are incompatible.\n" );
            return 0;
        }
        if ( !Abc_NtkIsStrash(pNtk) )
        {
            Abc_Print( -1, "The current network should be an AIG.\n" );
            return 0;
        }
        if ( pAbc->pCex == NULL )
        {
            Abc_Print( -1, "The current CEX is not available.\n" );
            return 0;
        }
        pMan = Abc_NtkToDar( pNtk, 0, 1 );
        vFailState = Saig_ManReturnFailingState( pMan, pAbc->pCex, fUseCexNs );
        //Vec_IntPrint( vFailState );
        Aig_ManStop( pMan );
        Abc_NtkForEachLatch( pNtk, pObj, i )
            if ( Vec_IntEntry( vFailState, i ) )
                Abc_LatchSetInit1( pObj );
            else
                Abc_LatchSetInit0( pObj );
        Vec_IntFree( vFailState );
    }
    else
        Abc_Print( -1, "The initial states remain unchanged.\n" );
    return 0;

usage:
    Abc_Print( -2, "usage: init [-zordcnh] [-S <init_string>]\n" );
    Abc_Print( -2, "\t         resets initial states of all latches\n" );
    Abc_Print( -2, "\t-z     : set zeros initial states [default = %s]\n", fZeros? "yes": "no" );
    Abc_Print( -2, "\t-o     : set ones initial states [default = %s]\n", fOnes? "yes": "no" );
    Abc_Print( -2, "\t-d     : set don't-care initial states [default = %s]\n", fDontCare? "yes": "no" );
    Abc_Print( -2, "\t-r     : set random initial states [default = %s]\n", fRandom? "yes": "no" );
    Abc_Print( -2, "\t-c     : set failure current state from the CEX (and run \"zero\") [default = %s]\n", fUseCexCs? "yes": "no" );
    Abc_Print( -2, "\t-n     : set next state after failure from the CEX (and run \"zero\") [default = %s]\n", fUseCexNs? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t-S str : (optional) initial state  [default = unused]\n" );
    return 1;
}